

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O0

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>::log
          (ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this,
          double __x)

{
  pointer pfVar1;
  ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this_00;
  long in_RSI;
  double extraout_XMM0_Qa;
  memory_buffer formatted;
  lock_guard<std::mutex> lock;
  allocator<char> *in_stack_fffffffffffffd88;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this_01;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  memory_buffer *in_stack_fffffffffffffd98;
  memory_buffer *formatted_00;
  ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>
  *in_stack_fffffffffffffda0;
  allocator<char> local_231;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_230;
  long local_10;
  ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *local_8;
  
  local_10 = in_RSI;
  local_8 = this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffd90,
             (mutex_type *)in_stack_fffffffffffffd88);
  std::allocator<char>::allocator();
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(&local_231);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x1392b0);
  (*pfVar1->_vptr_formatter[2])(pfVar1,local_10,&local_230);
  if (((this->should_do_colors_ & 1U) == 0) ||
     (*(ulong *)(local_10 + 0x30) <= *(ulong *)(local_10 + 0x28))) {
    this_01 = &local_230;
    fmt::v5::internal::basic_buffer<char>::size((basic_buffer<char> *)this_01);
    print_range_(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (size_t)in_stack_fffffffffffffd90,(size_t)this_01);
  }
  else {
    print_range_(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (size_t)in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88);
    this_00 = (ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *)
              std::
              unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffd90,(key_type *)in_stack_fffffffffffffd88);
    print_ccode_(this_00,(string *)in_stack_fffffffffffffd98);
    print_range_(this_00,in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90,
                 (size_t)in_stack_fffffffffffffd88);
    print_ccode_(this_00,(string *)in_stack_fffffffffffffd98);
    formatted_00 = *(memory_buffer **)(local_10 + 0x30);
    in_stack_fffffffffffffd90 = &local_230;
    fmt::v5::internal::basic_buffer<char>::size((basic_buffer<char> *)in_stack_fffffffffffffd90);
    print_range_(this_00,formatted_00,(size_t)in_stack_fffffffffffffd90,
                 (size_t)in_stack_fffffffffffffd88);
  }
  fflush((FILE *)this->target_file_);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            (in_stack_fffffffffffffd90);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x139445);
  return extraout_XMM0_Qa;
}

Assistant:

void log(const details::log_msg &msg) override
    {
        // Wrap the originally formatted message in color codes.
        // If color is not supported in the terminal, log as is instead.
        std::lock_guard<mutex_t> lock(mutex_);

        fmt::memory_buffer formatted;
        formatter_->format(msg, formatted);
        if (should_do_colors_ && msg.color_range_end > msg.color_range_start)
        {
            // before color range
            print_range_(formatted, 0, msg.color_range_start);
            // in color range
            print_ccode_(colors_[msg.level]);
            print_range_(formatted, msg.color_range_start, msg.color_range_end);
            print_ccode_(reset);
            // after color range
            print_range_(formatted, msg.color_range_end, formatted.size());
        }
        else // no color
        {
            print_range_(formatted, 0, formatted.size());
        }
        fflush(target_file_);
    }